

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O2

qpdflogger_handle qpdflogger_default_logger(void)

{
  __shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> *this;
  __shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this = (__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> *)operator_new(0x10);
  QPDFLogger::defaultLogger();
  std::__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return (qpdflogger_handle)this;
}

Assistant:

qpdflogger_handle
qpdflogger_default_logger()
{
    return new _qpdflogger_handle(QPDFLogger::defaultLogger());
}